

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

int32_t __thiscall icu_63::DecimalFormat::getMultiplier(DecimalFormat *this)

{
  int32_t x;
  DecimalFormatProperties *pDVar1;
  int iVar2;
  double dVar3;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  iVar2 = pDVar1->multiplier;
  if (iVar2 == 1) {
    x = pDVar1->magnitudeMultiplier;
    if (x == 0) {
      return 1;
    }
    dVar3 = uprv_pow10_63(x);
    iVar2 = (int)dVar3;
  }
  return iVar2;
}

Assistant:

int32_t DecimalFormat::getMultiplier(void) const {
    if (fields->properties->multiplier != 1) {
        return fields->properties->multiplier;
    } else if (fields->properties->magnitudeMultiplier != 0) {
        return static_cast<int32_t>(uprv_pow10(fields->properties->magnitudeMultiplier));
    } else {
        return 1;
    }
}